

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_lights.cxx
# Opt level: O1

void __thiscall xray_re::xr_scene_lights::save_v12(xr_scene_lights *this,xr_ini_writer *w)

{
  pointer pxVar1;
  size_t in_RCX;
  void *__buf;
  pointer pxVar2;
  
  xr_ini_writer::open_section(w,"lcontrols");
  pxVar1 = (this->m_controls).
           super__Vector_base<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pxVar2 = (this->m_controls).
                super__Vector_base<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>._M_impl.
                super__Vector_impl_data._M_start; pxVar2 != pxVar1; pxVar2 = pxVar2 + 1) {
    xr_ini_writer::write(w,(int)(pxVar2->name)._M_dataplus._M_p,(void *)(ulong)pxVar2->id,in_RCX);
  }
  xr_ini_writer::close_section(w);
  xr_ini_writer::open_section(w,"main");
  xr_ini_writer::write(w,0x1e66ca,(void *)(ulong)this->m_flags,in_RCX);
  xr_ini_writer::write
            (w,0x1f1bf1,
             (void *)(((long)(this->m_controls).
                             super__Vector_base<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_controls).
                             super__Vector_base<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333),
             in_RCX);
  xr_ini_writer::write
            (w,0x1f17ed,
             (void *)((long)(this->super_xr_scene_objects).m_objects.
                            super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->super_xr_scene_objects).m_objects.
                            super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3),in_RCX);
  xr_ini_writer::write(w,0x1f1c03,__buf,in_RCX);
  xr_ini_writer::write(w,0x1f3d25,(void *)0x0,in_RCX);
  xr_ini_writer::close_section(w);
  xr_scene::write_revision((this->super_xr_scene_objects).super_xr_scene_part.m_scene,w,true);
  xr_scene_objects::save_v12(&this->super_xr_scene_objects,w);
  return;
}

Assistant:

void xr_scene_lights::save_v12(xr_ini_writer* w) const
{
	w->open_section("lcontrols");
	w->w_ini_seq(m_controls, write_ini_token());
	w->close_section();

	w->open_section("main");
	w->write("flags", this->m_flags);
	w->write("lcontrol_last_idx", this->m_controls.size());
	w->write("objects_count", this->objects().size());
	w->write("sun_shadow_dir", this->m_sun);
	w->write("version", 0);
	w->close_section();

	scene().write_revision(w);

	xr_scene_objects::save_v12(w);
}